

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes2ts.cc
# Opt level: O2

bool __thiscall libwebm::VpxPes2Ts::ConvertToFile(VpxPes2Ts *this)

{
  bool bVar1;
  pointer __p;
  FILE *__p_00;
  Webm2Pes *pWVar2;
  __uniq_ptr_impl<_IO_FILE,_libwebm::FILEDeleter> local_18;
  
  __p_00 = fopen((this->output_file_name_)._M_dataplus._M_p,"wb");
  local_18._M_t.super__Tuple_impl<0UL,__IO_FILE_*,_libwebm::FILEDeleter>.
  super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl =
       (tuple<_IO_FILE_*,_libwebm::FILEDeleter>)
       (_Tuple_impl<0UL,__IO_FILE_*,_libwebm::FILEDeleter>)0x0;
  std::__uniq_ptr_impl<_IO_FILE,_libwebm::FILEDeleter>::reset
            ((__uniq_ptr_impl<_IO_FILE,_libwebm::FILEDeleter> *)&this->output_file_,(pointer)__p_00)
  ;
  std::unique_ptr<_IO_FILE,_libwebm::FILEDeleter>::~unique_ptr
            ((unique_ptr<_IO_FILE,_libwebm::FILEDeleter> *)&local_18);
  if ((this->output_file_)._M_t.super___uniq_ptr_impl<_IO_FILE,_libwebm::FILEDeleter>._M_t.
      super__Tuple_impl<0UL,__IO_FILE_*,_libwebm::FILEDeleter>.
      super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl == (_IO_FILE *)0x0) {
    bVar1 = false;
    fprintf(_stderr,"VpxPes2Ts: Cannot open %s for output.\n",
            (this->output_file_name_)._M_dataplus._M_p);
  }
  else {
    pWVar2 = (Webm2Pes *)operator_new(0xa8);
    Webm2Pes::Webm2Pes(pWVar2,&this->input_file_name_,&this->super_PacketReceiverInterface);
    std::__uniq_ptr_impl<libwebm::Webm2Pes,_std::default_delete<libwebm::Webm2Pes>_>::reset
              ((__uniq_ptr_impl<libwebm::Webm2Pes,_std::default_delete<libwebm::Webm2Pes>_> *)
               &this->pes_converter_,pWVar2);
    pWVar2 = (this->pes_converter_)._M_t.
             super___uniq_ptr_impl<libwebm::Webm2Pes,_std::default_delete<libwebm::Webm2Pes>_>._M_t.
             super__Tuple_impl<0UL,_libwebm::Webm2Pes_*,_std::default_delete<libwebm::Webm2Pes>_>.
             super__Head_base<0UL,_libwebm::Webm2Pes_*,_false>._M_head_impl;
    if (pWVar2 == (Webm2Pes *)0x0) {
      fwrite("VpxPes2Ts: Out of memory.\n",0x1a,1,_stderr);
      bVar1 = false;
    }
    else {
      bVar1 = Webm2Pes::ConvertToPacketReceiver(pWVar2);
    }
  }
  return bVar1;
}

Assistant:

bool VpxPes2Ts::ConvertToFile() {
  output_file_ = FilePtr(fopen(output_file_name_.c_str(), "wb"), FILEDeleter());
  if (output_file_ == nullptr) {
    std::fprintf(stderr, "VpxPes2Ts: Cannot open %s for output.\n",
                 output_file_name_.c_str());
    return false;
  }
  pes_converter_.reset(new Webm2Pes(input_file_name_, this));
  if (pes_converter_ == nullptr) {
    std::fprintf(stderr, "VpxPes2Ts: Out of memory.\n");
    return false;
  }
  return pes_converter_->ConvertToPacketReceiver();
}